

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_glows.cxx
# Opt level: O0

void __thiscall xray_re::xr_glow_object::save_v12(xr_glow_object *this,xr_ini_writer *w)

{
  xr_ini_writer *pxVar1;
  size_t in_RCX;
  size_t __n;
  void *__buf;
  string local_68 [48];
  string local_38 [32];
  xr_ini_writer *local_18;
  xr_ini_writer *w_local;
  xr_glow_object *this_local;
  
  local_18 = w;
  w_local = (xr_ini_writer *)this;
  xr_custom_object::save_v12(&this->super_xr_custom_object,w);
  xr_ini_writer::write(local_18,0x2e4e39,(void *)0x12,in_RCX);
  xr_ini_writer::write(local_18,0x2e3bad,__buf,in_RCX);
  pxVar1 = local_18;
  std::__cxx11::string::string(local_38,(string *)&this->m_shader);
  xr_ini_writer::write(pxVar1,0x2e2940,local_38,0);
  std::__cxx11::string::~string(local_38);
  pxVar1 = local_18;
  std::__cxx11::string::string(local_68,(string *)&this->m_texture);
  __n = 0;
  xr_ini_writer::write(pxVar1,0x2e294c,local_68,0);
  std::__cxx11::string::~string(local_68);
  xr_ini_writer::write(local_18,0x2e40af,(void *)(ulong)this->m_flags,__n);
  return;
}

Assistant:

void xr_glow_object::save_v12(xr_ini_writer* w) const
{
	xr_custom_object::save_v12(w);

	w->write("version", GLOW_VERSION);
	w->write("radius", m_radius);
	w->write("shader_name", m_shader, false);
	w->write("texture_name", m_texture, false);

	w->write("flags", m_flags);
}